

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_SetPropertyValue(JSContext *ctx,JSValue this_obj,JSValue prop,JSValue val,int flags)

{
  JSValue v_00;
  JSValue v_01;
  JSValue val_00;
  JSValue val_01;
  JSValue new_val;
  JSValue new_val_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue val_06;
  JSValue val_07;
  JSAtom JVar1;
  int iVar2;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  JSContext *in_RDI;
  int in_R8D;
  uint in_R9D;
  int ret;
  JSAtom atom;
  JSShape *sh1;
  JSObject *p1;
  int32_t v;
  double d;
  uint32_t idx;
  JSObject *p;
  undefined4 in_stack_00000114;
  JSContext *in_stack_00000118;
  undefined1 in_stack_00000120 [16];
  undefined1 in_stack_00000130 [16];
  int in_stack_000001f0;
  JSAtom in_stack_ffffffffffffff6c;
  JSContext *in_stack_ffffffffffffff70;
  JSContext *in_stack_ffffffffffffff78;
  JSContext *ctx_00;
  undefined7 in_stack_ffffffffffffff88;
  bool bVar3;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  JSContext *in_stack_ffffffffffffff98;
  JSShape *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  double in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  
  ctx_00 = (JSContext *)&stack0x00000008;
  bVar3 = in_EDX == -1 && in_R8D == 0;
  if (in_EDX != -1 || in_R8D != 0) goto LAB_0012dd18;
  in_stack_ffffffffffffff78 = (JSContext *)(ulong)(*(ushort *)(in_RSI + 6) - 2);
  switch(in_stack_ffffffffffffff78) {
  case (JSContext *)0x0:
    if (in_ECX < *(uint *)(in_RSI + 0x40)) {
      new_val.u._7_1_ = bVar3;
      new_val.u._0_7_ = in_stack_ffffffffffffff88;
      new_val.tag._0_4_ = in_stack_ffffffffffffff90;
      new_val.tag._4_4_ = in_stack_ffffffffffffff94;
      set_value(ctx_00,(JSValue *)in_stack_ffffffffffffff78,new_val);
      return 1;
    }
    if (((in_ECX == *(uint *)(in_RSI + 0x40)) && ((*(byte *)(in_RSI + 5) >> 3 & 1) != 0)) &&
       ((*(byte *)(in_RSI + 5) & 1) != 0)) {
      in_stack_ffffffffffffffa0 = *(JSShape **)(*(long *)(in_RSI + 0x18) + 0x38);
      do {
        if (in_stack_ffffffffffffffa0 == (JSShape *)0x0) {
          val_02.tag = 0;
          val_02.u.ptr = in_stack_ffffffffffffff98;
          iVar2 = add_fast_array_element
                            ((JSContext *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             (JSObject *)CONCAT17(bVar3,in_stack_ffffffffffffff88),val_02,
                             (int)((ulong)ctx_00 >> 0x20));
          return iVar2;
        }
        in_stack_ffffffffffffff98 = *(JSContext **)&in_stack_ffffffffffffffa0->is_hashed;
        if ((in_stack_ffffffffffffffa0->header).dummy2 == 2) {
          if (((in_stack_ffffffffffffffa0->header).dummy1 >> 3 & 1) == 0) break;
        }
        else if (((in_stack_ffffffffffffffa0->header).dummy2 != 1) ||
                (*(char *)((long)&in_stack_ffffffffffffff98->rt + 1) != '\0')) break;
        in_stack_ffffffffffffffa0 = in_stack_ffffffffffffff98->array_shape;
      } while( true );
    }
    goto LAB_0012dd18;
  default:
    goto LAB_0012dd18;
  case (JSContext *)0x6:
    if (in_ECX < *(uint *)(in_RSI + 0x40)) {
      new_val_00.u._7_1_ = bVar3;
      new_val_00.u._0_7_ = in_stack_ffffffffffffff88;
      new_val_00.tag._0_4_ = in_stack_ffffffffffffff90;
      new_val_00.tag._4_4_ = in_stack_ffffffffffffff94;
      set_value(ctx_00,(JSValue *)in_stack_ffffffffffffff78,new_val_00);
      return 1;
    }
LAB_0012dd18:
    val_04.tag._0_4_ = in_stack_ffffffffffffffa8;
    val_04.u.ptr = in_stack_ffffffffffffffa0;
    val_04.tag._4_4_ = in_stack_ffffffffffffffac;
    JVar1 = JS_ValueToAtom(in_stack_ffffffffffffff98,val_04);
    v_00.tag._0_4_ = (int)ctx_00;
    v_00.u = (int32_t)in_stack_ffffffffffffff78;
    v_00.tag._4_4_ = (int)((ulong)ctx_00 >> 0x20);
    JS_FreeValue(in_stack_ffffffffffffff70,v_00);
    if (JVar1 != 0) {
      iVar2 = JS_SetPropertyInternal
                        (in_stack_00000118,(JSValue)in_stack_00000130,in_stack_00000114,
                         (JSValue)in_stack_00000120,in_stack_000001f0);
      JS_FreeAtom(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
      return iVar2;
    }
    v_01.tag._0_4_ = (int)ctx_00;
    v_01.u = (int32_t)in_stack_ffffffffffffff78;
    v_01.tag._4_4_ = (int)((ulong)ctx_00 >> 0x20);
    JS_FreeValue(in_stack_ffffffffffffff70,v_01);
    return -1;
  case (JSContext *)0x13:
    val_03.tag._0_4_ = in_stack_ffffffffffffffa8;
    val_03.u.ptr = in_stack_ffffffffffffffa0;
    val_03.tag._4_4_ = in_stack_ffffffffffffffac;
    iVar2 = JS_ToUint8ClampFree(in_stack_ffffffffffffff98,
                                (int32_t *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),val_03
                               );
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) {
LAB_0012dcc7:
      iVar2 = JS_ThrowTypeErrorOrFalse(in_RDI,(int)(ulong)in_R9D,"out-of-bound numeric index");
      return iVar2;
    }
    *(char *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX) = (char)in_stack_ffffffffffffffac;
    break;
  case (JSContext *)0x14:
  case (JSContext *)0x15:
    val_05.tag._0_4_ = in_stack_ffffffffffffffb8;
    val_05.u.float64 = in_stack_ffffffffffffffb0;
    val_05.tag._4_4_ = in_ECX;
    iVar2 = JS_ToInt32Free((JSContext *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int32_t *)in_stack_ffffffffffffffa0,val_05);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) goto LAB_0012dcc7;
    *(char *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX) = (char)in_stack_ffffffffffffffac;
    break;
  case (JSContext *)0x16:
  case (JSContext *)0x17:
    val_06.tag._0_4_ = in_stack_ffffffffffffffb8;
    val_06.u.float64 = in_stack_ffffffffffffffb0;
    val_06.tag._4_4_ = in_ECX;
    iVar2 = JS_ToInt32Free((JSContext *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int32_t *)in_stack_ffffffffffffffa0,val_06);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) goto LAB_0012dcc7;
    *(short *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX * 2) = (short)in_stack_ffffffffffffffac;
    break;
  case (JSContext *)0x18:
  case (JSContext *)0x19:
    val_07.tag._0_4_ = in_stack_ffffffffffffffb8;
    val_07.u.float64 = in_stack_ffffffffffffffb0;
    val_07.tag._4_4_ = in_ECX;
    iVar2 = JS_ToInt32Free((JSContext *)
                           CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           (int32_t *)in_stack_ffffffffffffffa0,val_07);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) goto LAB_0012dcc7;
    *(undefined4 *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX * 4) = in_stack_ffffffffffffffac;
    break;
  case (JSContext *)0x1a:
    val_00.tag._0_7_ = in_stack_ffffffffffffff88;
    val_00.u = (int32_t)ctx_00;
    val_00.tag._7_1_ = bVar3;
    iVar2 = JS_ToFloat64Free(in_stack_ffffffffffffff78,(double *)in_stack_ffffffffffffff70,val_00);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) goto LAB_0012dcc7;
    *(float *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX * 4) = (float)in_stack_ffffffffffffffb0;
    break;
  case (JSContext *)0x1b:
    val_01.tag._0_7_ = in_stack_ffffffffffffff88;
    val_01.u = (int32_t)ctx_00;
    val_01.tag._7_1_ = bVar3;
    iVar2 = JS_ToFloat64Free(in_stack_ffffffffffffff78,(double *)in_stack_ffffffffffffff70,val_01);
    if (iVar2 != 0) {
      return -1;
    }
    if (*(uint *)(in_RSI + 0x40) <= in_ECX) goto LAB_0012dcc7;
    *(double *)(*(long *)(in_RSI + 0x38) + (ulong)in_ECX * 8) = in_stack_ffffffffffffffb0;
  }
  return 1;
}

Assistant:

static int JS_SetPropertyValue(JSContext *ctx, JSValueConst this_obj,
                               JSValue prop, JSValue val, int flags)
{
    if (likely(JS_VALUE_GET_TAG(this_obj) == JS_TAG_OBJECT &&
               JS_VALUE_GET_TAG(prop) == JS_TAG_INT)) {
        JSObject *p;
        uint32_t idx;
        double d;
        int32_t v;

        /* fast path for array access */
        p = JS_VALUE_GET_OBJ(this_obj);
        idx = JS_VALUE_GET_INT(prop);
        switch(p->class_id) {
        case JS_CLASS_ARRAY:
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
                JSObject *p1;
                JSShape *sh1;

                /* fast path to add an element to the array */
                if (idx != (uint32_t)p->u.array.count ||
                    !p->fast_array || !p->extensible)
                    goto slow_path;
                /* check if prototype chain has a numeric property */
                p1 = p->shape->proto;
                while (p1 != NULL) {
                    sh1 = p1->shape;
                    if (p1->class_id == JS_CLASS_ARRAY) {
                        if (unlikely(!p1->fast_array))
                            goto slow_path;
                    } else if (p1->class_id == JS_CLASS_OBJECT) {
                        if (unlikely(sh1->has_small_array_index))
                            goto slow_path;
                    } else {
                        goto slow_path;
                    }
                    p1 = sh1->proto;
                }
                /* add element */
                return add_fast_array_element(ctx, p, val, flags);
            }
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_ARGUMENTS:
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto slow_path;
            set_value(ctx, &p->u.array.u.values[idx], val);
            break;
        case JS_CLASS_UINT8C_ARRAY:
            if (JS_ToUint8ClampFree(ctx, &v, val))
                return -1;
            /* Note: the conversion can detach the typed array, so the
               array bound check must be done after */
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT8_ARRAY:
        case JS_CLASS_UINT8_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint8_ptr[idx] = v;
            break;
        case JS_CLASS_INT16_ARRAY:
        case JS_CLASS_UINT16_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint16_ptr[idx] = v;
            break;
        case JS_CLASS_INT32_ARRAY:
        case JS_CLASS_UINT32_ARRAY:
            if (JS_ToInt32Free(ctx, &v, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.uint32_ptr[idx] = v;
            break;
#ifdef CONFIG_BIGNUM
        case JS_CLASS_BIG_INT64_ARRAY:
        case JS_CLASS_BIG_UINT64_ARRAY:
            /* XXX: need specific conversion function */
            {
                int64_t v;
                if (JS_ToBigInt64Free(ctx, &v, val))
                    return -1;
                if (unlikely(idx >= (uint32_t)p->u.array.count))
                    goto ta_out_of_bound;
                p->u.array.u.uint64_ptr[idx] = v;
            }
            break;
#endif
        case JS_CLASS_FLOAT32_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count))
                goto ta_out_of_bound;
            p->u.array.u.float_ptr[idx] = d;
            break;
        case JS_CLASS_FLOAT64_ARRAY:
            if (JS_ToFloat64Free(ctx, &d, val))
                return -1;
            if (unlikely(idx >= (uint32_t)p->u.array.count)) {
            ta_out_of_bound:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound numeric index");
            }
            p->u.array.u.double_ptr[idx] = d;
            break;
        default:
            goto slow_path;
        }
        return TRUE;
    } else {
        JSAtom atom;
        int ret;
    slow_path:
        atom = JS_ValueToAtom(ctx, prop);
        JS_FreeValue(ctx, prop);
        if (unlikely(atom == JS_ATOM_NULL)) {
            JS_FreeValue(ctx, val);
            return -1;
        }
        ret = JS_SetPropertyInternal(ctx, this_obj, atom, val, flags);
        JS_FreeAtom(ctx, atom);
        return ret;
    }
}